

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VAddConst_Serial(N_Vector x,realtype b,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  realtype *zd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  realtype b_local;
  N_Vector x_local;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar3 = *(long *)((long)z->content + 0x10);
  for (N = 0; N < lVar1; N = N + 1) {
    *(double *)(lVar3 + N * 8) = *(double *)(lVar2 + N * 8) + b;
  }
  return;
}

Assistant:

void N_VAddConst_Serial(N_Vector x, realtype b, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = xd[i]+b;

  return;
}